

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

void websocket_on_pubsub_message_direct_internal(fio_msg_s *msg,uint8_t txt)

{
  void *uuid;
  ws_s *ws;
  int *piVar1;
  FIOBJ o;
  size_t sVar2;
  byte local_78;
  undefined1 local_60 [8];
  fio_str_s tmp;
  FIOBJ pre_wrapped;
  FIOBJ message;
  fio_protocol_s *pr;
  uint8_t txt_local;
  fio_msg_s *msg_local;
  
  ws = (ws_s *)fio_protocol_try_lock((intptr_t)msg->udata1,FIO_PR_LOCK_WRITE);
  if (ws == (ws_s *)0x0) {
    piVar1 = __errno_location();
    if (*piVar1 == 9) {
      return;
    }
    fio_message_defer(msg);
    return;
  }
  tmp.data = (char *)0x0;
  if (ws->is_client == '\0') {
    if (txt == '\0') {
      tmp.data = (char *)fio_message_metadata(msg,-0x22);
    }
    else if (txt == '\x01') {
      tmp.data = (char *)fio_message_metadata(msg,-0x21);
    }
    else if (txt == '\x02') {
      tmp.data = (char *)fio_message_metadata(msg,-0x20);
    }
    if (tmp.data != (char *)0x0) {
      uuid = msg->udata1;
      o = fiobj_dup((FIOBJ)tmp.data);
      fiobj_send_free((intptr_t)uuid,o);
      goto LAB_0018a82b;
    }
  }
  pr._7_1_ = txt;
  if (txt == '\x02') {
    local_60._0_4_ = 0;
    local_60[4] = '\0';
    local_60[5] = '\0';
    memset(local_60 + 6,0,10);
    tmp.reserved[2] = '\0';
    tmp.reserved[3] = '\0';
    tmp.reserved[4] = '\0';
    tmp.reserved[5] = '\0';
    tmp.reserved[6] = '\0';
    tmp.reserved[7] = '\0';
    tmp.reserved[8] = '\0';
    tmp.reserved[9] = '\0';
    tmp.capa = (msg->msg).len;
    tmp.len = 0;
    tmp.dealloc = (_func_void_void_ptr *)(msg->msg).data;
    if (tmp.capa < 0x8000) {
      sVar2 = fio_str_utf8_valid((fio_str_s *)local_60);
      local_78 = (byte)sVar2;
    }
    else {
      local_78 = 0;
    }
    pr._7_1_ = local_78;
  }
  websocket_write(ws,msg->msg,pr._7_1_ & 1);
  fiobj_free(0);
LAB_0018a82b:
  fio_protocol_unlock((fio_protocol_s *)ws,FIO_PR_LOCK_WRITE);
  return;
}

Assistant:

static inline void websocket_on_pubsub_message_direct_internal(fio_msg_s *msg,
                                                               uint8_t txt) {
  fio_protocol_s *pr =
      fio_protocol_try_lock((intptr_t)msg->udata1, FIO_PR_LOCK_WRITE);
  if (!pr) {
    if (errno == EBADF)
      return;
    fio_message_defer(msg);
    return;
  }
  FIOBJ message = FIOBJ_INVALID;
  FIOBJ pre_wrapped = FIOBJ_INVALID;
  if (!((ws_s *)pr)->is_client) {
    /* pre-wrapping is only for client data */
    switch (txt) {
    case 0:
      pre_wrapped =
          (FIOBJ)fio_message_metadata(msg, WEBSOCKET_OPTIMIZE_PUBSUB_BINARY);
      break;
    case 1:
      pre_wrapped =
          (FIOBJ)fio_message_metadata(msg, WEBSOCKET_OPTIMIZE_PUBSUB_TEXT);
      break;
    case 2:
      pre_wrapped = (FIOBJ)fio_message_metadata(msg, WEBSOCKET_OPTIMIZE_PUBSUB);
      break;
    default:
      break;
    }
    if (pre_wrapped) {
      // FIO_LOG_DEBUG(
      //     "pub/sub WebSocket optimization route for pre-wrapped message.");
      fiobj_send_free((intptr_t)msg->udata1, fiobj_dup(pre_wrapped));
      goto finish;
    }
  }
  if (txt == 2) {
    /* unknown text state */
    fio_str_s tmp =
        FIO_STR_INIT_STATIC2(msg->msg.data, msg->msg.len); // don't free
    txt = (tmp.len >= (2 << 14) ? 0 : fio_str_utf8_valid(&tmp));
  }
  websocket_write((ws_s *)pr, msg->msg, txt & 1);
  fiobj_free(message);
finish:
  fio_protocol_unlock(pr, FIO_PR_LOCK_WRITE);
}